

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O2

int ArgPos(char *str,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = argc + -2;
  lVar3 = 1;
  while( true ) {
    if (argc <= lVar3) {
      return -1;
    }
    iVar1 = strcmp(str,argv[lVar3]);
    if (iVar1 == 0) break;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + -1;
  }
  if (iVar2 != 0) {
    return (int)lVar3;
  }
  printf("Argument missing for %s\n",str);
  exit(1);
}

Assistant:

int ArgPos(char *str, int argc, char **argv) {
  int a;
  for (a = 1; a < argc; a++) if (!strcmp(str, argv[a])) {
    if (a == argc - 1) {
      printf("Argument missing for %s\n", str);
      exit(1);
    }
    return a;
  }
  return -1;
}